

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_stage.hpp
# Opt level: O0

void so_5::impl::
     run_stage<so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_agent_core_and_go_further(std::function<void()>)::__0,so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_agent_core_and_go_further(std::function<void()>)::__1,so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_agent_core_and_go_further(std::function<void()>)::__2>
               (string *stage_name,anon_class_8_1_8991fb9c *init_fn,
               anon_class_8_1_8991fb9c *deinit_fn,anon_class_40_2_424c5504 *next_stage)

{
  exception *x_2;
  exception *nested;
  exception *x_1;
  exception *x;
  anon_class_40_2_424c5504 *next_stage_local;
  anon_class_8_1_8991fb9c *deinit_fn_local;
  anon_class_8_1_8991fb9c *init_fn_local;
  string *stage_name_local;
  
  env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_agent_core_and_go_further::
  anon_class_8_1_8991fb9c::operator()(init_fn);
  env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_agent_core_and_go_further::
  anon_class_40_2_424c5504::operator()(next_stage);
  env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_agent_core_and_go_further::
  anon_class_8_1_8991fb9c::operator()(deinit_fn);
  return;
}

Assistant:

void
run_stage(
	const std::string & stage_name,
	INIT_FN && init_fn,
	DEINIT_FN && deinit_fn,
	NEXT_STAGE && next_stage )
{
	try
	{
		init_fn();
	}
	catch( const std::exception & x )
	{
		SO_5_THROW_EXCEPTION(
				rc_unexpected_error,
				stage_name + ": initialization failed, exception is: '" +
				x.what() + "'" );
	}

	try
	{
		next_stage();
	}
	catch( const std::exception & x )
	{
		try
		{
			deinit_fn();
		}
		catch( const std::exception & nested )
		{
			SO_5_THROW_EXCEPTION(
					rc_unexpected_error,
					stage_name + ": deinitialization failed during "
					"exception handling. Original exception is: '" + x.what() +
					"', deinitialization exception is: '" + nested.what() + "'" );
		}

		throw;
	}

	try
	{
		deinit_fn();
	}
	catch( const std::exception & x )
	{
		SO_5_THROW_EXCEPTION(
				rc_unexpected_error,
				stage_name + ": deinitialization failed, exception is: '" +
				x.what() + "'" );
	}
}